

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O2

void __thiscall sf::VertexBuffer::VertexBuffer(VertexBuffer *this,VertexBuffer *copy)

{
  Usage UVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_0026d390;
  GlResource::GlResource((GlResource *)this);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__VertexBuffer_00270870;
  this->m_buffer = 0;
  this->m_size = 0;
  UVar1 = copy->m_usage;
  this->m_primitiveType = copy->m_primitiveType;
  this->m_usage = UVar1;
  if ((copy->m_buffer != 0) && (copy->m_size != 0)) {
    bVar2 = create(this,copy->m_size);
    if (bVar2) {
      bVar2 = update(this,copy);
      if (bVar2) {
        return;
      }
      poVar3 = err();
      pcVar4 = "Could not copy vertex buffer";
    }
    else {
      poVar3 = err();
      pcVar4 = "Could not create vertex buffer for copying";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

VertexBuffer::VertexBuffer(const VertexBuffer& copy) :
m_buffer       (0),
m_size         (0),
m_primitiveType(copy.m_primitiveType),
m_usage        (copy.m_usage)
{
    if (copy.m_buffer && copy.m_size)
    {
        if (!create(copy.m_size))
        {
            err() << "Could not create vertex buffer for copying" << std::endl;
            return;
        }

        if (!update(copy))
            err() << "Could not copy vertex buffer" << std::endl;
    }
}